

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

string * __thiscall
glcts::PipelineStatisticsQueryUtilities::getStringForDrawCallType_abi_cxx11_
          (string *__return_storage_ptr__,PipelineStatisticsQueryUtilities *this,
          _draw_call_type draw_call_type)

{
  allocator<char> local_16;
  undefined1 local_15;
  undefined4 local_14;
  string *psStack_10;
  _draw_call_type draw_call_type_local;
  string *result;
  
  local_14 = SUB84(this,0);
  local_15 = 0;
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[?]",&local_16);
  std::allocator<char>::~allocator(&local_16);
  switch(local_14) {
  case 0:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"glDrawArrays()");
    break;
  case 1:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"glDrawArraysIndirect()");
    break;
  case 2:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"glDrawArraysInstanced()");
    break;
  case 3:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"glDrawArraysInstancedBaseInstance()");
    break;
  case 4:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"glDrawElements()");
    break;
  case 5:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"glDrawElementsBaseVertex()");
    break;
  case 6:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"glDrawElementsIndirect()");
    break;
  case 7:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"glDrawElementsInstanced()");
    break;
  case 8:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"glDrawElementsInstancedBaseInstance()");
    break;
  case 9:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"glDrawElementsInstancedBaseVertexBaseInstance()");
    break;
  case 10:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"glDrawRangeElements()");
    break;
  case 0xb:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"glDrawRangeElementsBaseVertex()");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PipelineStatisticsQueryUtilities::getStringForDrawCallType(_draw_call_type draw_call_type)
{
	std::string result = "[?]";

	switch (draw_call_type)
	{
	case DRAW_CALL_TYPE_GLDRAWARRAYS:
		result = "glDrawArrays()";
		break;
	case DRAW_CALL_TYPE_GLDRAWARRAYSINDIRECT:
		result = "glDrawArraysIndirect()";
		break;
	case DRAW_CALL_TYPE_GLDRAWARRAYSINSTANCED:
		result = "glDrawArraysInstanced()";
		break;
	case DRAW_CALL_TYPE_GLDRAWARRAYSINSTANCEDBASEINSTANCE:
		result = "glDrawArraysInstancedBaseInstance()";
		break;
	case DRAW_CALL_TYPE_GLDRAWELEMENTS:
		result = "glDrawElements()";
		break;
	case DRAW_CALL_TYPE_GLDRAWELEMENTSBASEVERTEX:
		result = "glDrawElementsBaseVertex()";
		break;
	case DRAW_CALL_TYPE_GLDRAWELEMENTSINDIRECT:
		result = "glDrawElementsIndirect()";
		break;
	case DRAW_CALL_TYPE_GLDRAWELEMENTSINSTANCED:
		result = "glDrawElementsInstanced()";
		break;
	case DRAW_CALL_TYPE_GLDRAWELEMENTSINSTANCEDBASEINSTANCE:
		result = "glDrawElementsInstancedBaseInstance()";
		break;
	case DRAW_CALL_TYPE_GLDRAWELEMENTSINSTANCEDBASEVERTEXBASEINSTANCE:
		result = "glDrawElementsInstancedBaseVertexBaseInstance()";
		break;
	case DRAW_CALL_TYPE_GLDRAWRANGEELEMENTS:
		result = "glDrawRangeElements()";
		break;
	case DRAW_CALL_TYPE_GLDRAWRANGEELEMENTSBASEVERTEX:
		result = "glDrawRangeElementsBaseVertex()";
		break;
	default:
		DE_ASSERT(0);
		break;
	}

	return result;
}